

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  bool bVar1;
  size_type sVar2;
  Column *in_RSI;
  Column *in_RDI;
  Column *col;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_> *__range3;
  value_type *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffffa8;
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
  local_30;
  Column *local_28;
  
  (in_RDI->m_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_RSI;
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::vector((vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
            *)0x19eee7);
  sVar2 = std::
          vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
          size((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                *)(in_RDI->m_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  in_RDI->m_indent = sVar2;
  std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::size
            ((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
              *)(in_RDI->m_strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::reserve(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_28 = (Column *)
             (in_RDI->m_strings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_30._M_current =
       (Column *)
       std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
       ::begin((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                *)in_stack_ffffffffffffff78);
  std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::end
            ((vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
              *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
    ::operator*(&local_30);
    in_stack_ffffffffffffff78 =
         (value_type *)
         &(in_RDI->m_strings).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    Column::begin(in_RDI);
    std::
    vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
    ::push_back((vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                 *)in_RDI,in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

explicit iterator(Columns const& columns)
			: m_columns(columns.m_columns),
			m_activeIterators(m_columns.size()) {
			m_iterators.reserve(m_columns.size());

			for (auto const& col : m_columns)
				m_iterators.push_back(col.begin());
		}